

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O2

int DataVector::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  ulong uVar1;
  double dVar2;
  undefined7 uVar3;
  const_reference cVar4;
  reference extraout_RAX;
  undefined7 extraout_var;
  const_reference __x;
  reference pvVar5;
  reference extraout_RAX_00;
  ulong *in_RCX;
  vector<DataPoint,_std::allocator<DataPoint>_> *in_RDX;
  vector<bool,_std::allocator<bool>_> *in_R8;
  ulong *in_R9;
  ulong __n;
  size_type i;
  ulong __n_00;
  
  deactivate((DataVector *)in_RDX);
  __n = 0;
  __n_00 = 0;
  pvVar5 = extraout_RAX;
  do {
    if (*(ulong *)src <= __n_00) {
      return (int)pvVar5;
    }
    if (__n_00 < *in_R9) {
      cVar4 = std::vector<bool,_std::allocator<bool>_>::at(in_R8,__n_00);
      pvVar5 = (reference)CONCAT71(extraout_var,cVar4);
      if (cVar4) goto LAB_00185190;
    }
    else {
LAB_00185190:
      uVar1 = *in_RCX;
      __x = std::vector<DataPoint,_std::allocator<DataPoint>_>::at
                      ((vector<DataPoint,_std::allocator<DataPoint>_> *)dst,__n_00);
      if (__n < uVar1) {
        pvVar5 = std::vector<DataPoint,_std::allocator<DataPoint>_>::at(in_RDX,__n);
        uVar3 = *(undefined7 *)&__x->field_0x1;
        dVar2 = __x->value;
        pvVar5->active = __x->active;
        *(undefined7 *)&pvVar5->field_0x1 = uVar3;
        pvVar5->value = dVar2;
      }
      else {
        std::vector<DataPoint,_std::allocator<DataPoint>_>::push_back(in_RDX,__x);
        pvVar5 = extraout_RAX_00;
      }
      __n = __n + 1;
    }
    __n_00 = __n_00 + 1;
  } while( true );
}

Assistant:

static
    void copy(DataVector const & src,
              DataVector::size_type const & numSrc,
              DataVector & dst,
              DataVector::size_type const & numDst,
              std::vector<bool> const & mask,
              DataVector::size_type const & numMask)
    {

        // Deactivate all destination value by default
        dst.deactivate();

        // Copy elements
        DataVector::size_type j = 0;
        for (DataVector::size_type i = 0; i < numSrc; i++)
        {
            // Check if current value is masked out
            if (i < numMask)
            {
                if (!mask.at(i)) continue;
            }

            // Add or set next value
            if (j >= numDst)
            {
                dst.push_back(src.at(i));
            }
            else
            {
                dst.at(j) = src.at(i);
            }
            j++;
        }

    }